

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

PHYSFS_sint64 UNPK_read(PHYSFS_Io *io,void *buffer,PHYSFS_uint64 len)

{
  long *plVar1;
  UNPKfileinfo *pUVar2;
  long lVar3;
  PHYSFS_sint64 rc;
  PHYSFS_uint64 bytesLeft;
  UNPKentry *entry;
  UNPKfileinfo *finfo;
  PHYSFS_uint64 len_local;
  void *buffer_local;
  PHYSFS_Io *io_local;
  
  plVar1 = (long *)io->opaque;
  pUVar2 = (UNPKfileinfo *)(*(long *)(plVar1[1] + 0x30) - (ulong)*(uint *)(plVar1 + 2));
  finfo = (UNPKfileinfo *)len;
  if (pUVar2 < len) {
    finfo = pUVar2;
  }
  lVar3 = (**(code **)(*plVar1 + 0x10))(*plVar1,buffer,finfo);
  if (0 < lVar3) {
    *(int *)(plVar1 + 2) = (int)lVar3 + (int)plVar1[2];
  }
  return lVar3;
}

Assistant:

static PHYSFS_sint64 UNPK_read(PHYSFS_Io *io, void *buffer, PHYSFS_uint64 len)
{
    UNPKfileinfo *finfo = (UNPKfileinfo *) io->opaque;
    const UNPKentry *entry = finfo->entry;
    const PHYSFS_uint64 bytesLeft = (PHYSFS_uint64)(entry->size-finfo->curPos);
    PHYSFS_sint64 rc;

    if (bytesLeft < len)
        len = bytesLeft;

    rc = finfo->io->read(finfo->io, buffer, len);
    if (rc > 0)
        finfo->curPos += (PHYSFS_uint32) rc;

    return rc;
}